

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.hpp
# Opt level: O0

void __thiscall zmq::blob_t::set_deep_copy(blob_t *this,blob_t *other_)

{
  void *pvVar1;
  blob_t *in_RSI;
  long *in_RDI;
  
  clear(in_RSI);
  pvVar1 = malloc(in_RSI->_size);
  *in_RDI = (long)pvVar1;
  if (*in_RDI == 0) {
    fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/blob.hpp"
            ,0x83);
    fflush(_stderr);
    zmq_abort((char *)0x1f3176);
  }
  in_RDI[1] = in_RSI->_size;
  *(undefined1 *)(in_RDI + 2) = 1;
  memcpy((void *)*in_RDI,in_RSI->_data,in_RDI[1]);
  return;
}

Assistant:

void set_deep_copy (blob_t const &other_)
    {
        clear ();
        _data = static_cast<unsigned char *> (malloc (other_._size));
        alloc_assert (_data);
        _size = other_._size;
        _owned = true;
        memcpy (_data, other_._data, _size);
    }